

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O2

bool crnlib::string_to_int(char **pBuf,int *value)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  
  *value = 0;
  pcVar7 = *pBuf;
  while( true ) {
    cVar2 = *pcVar7;
    if (cVar2 == '\0') {
      return false;
    }
    iVar3 = isspace((int)cVar2);
    if (iVar3 == 0) break;
    pcVar7 = pcVar7 + 1;
  }
  uVar1 = (int)cVar2 - 0x3a;
  if (uVar1 < 0xfffffff6) {
    if (cVar2 != '-') {
      return false;
    }
    pcVar7 = pcVar7 + 1;
  }
  uVar5 = 0;
  while( true ) {
    if ((*pcVar7 == '\0') || (uVar6 = (int)*pcVar7 - 0x30, 9 < uVar6)) {
      if (uVar1 < 0xfffffff6) {
        if (0x80000000 < uVar5) {
          return false;
        }
        uVar5 = -uVar5;
      }
      else if ((int)uVar5 < 0) {
        return false;
      }
      *value = uVar5;
      *pBuf = pcVar7;
      return true;
    }
    if (0x1fffffff < uVar5) {
      return false;
    }
    if (CARRY4(uVar5 * 8,uVar5 * 2)) break;
    uVar4 = uVar5 * 10;
    pcVar7 = pcVar7 + 1;
    uVar5 = uVar4 + uVar6;
    if (CARRY4(uVar4,uVar6)) {
      return false;
    }
  }
  return false;
}

Assistant:

bool string_to_int(const char*& pBuf, int& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint result = 0;
        bool negative = false;

        if (!isdigit(*p))
        {
            if (p[0] == '-')
            {
                negative = true;
                p++;
            }
            else
            {
                return false;
            }
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE0000000U)
            {
                return false;
            }

            const uint result8 = result << 3U;
            const uint result2 = result << 1U;

            if (result2 > (0xFFFFFFFFU - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFU - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        if (negative)
        {
            if (result > 0x80000000U)
            {
                value = 0;
                return false;
            }
            value = -static_cast<int>(result);
        }
        else
        {
            if (result > 0x7FFFFFFFU)
            {
                value = 0;
                return false;
            }
            value = static_cast<int>(result);
        }

        pBuf = p;

        return true;
    }